

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mailManager.cpp
# Opt level: O0

int __thiscall
mailManager::listMail
          (mailManager *this,
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *map1)

{
  size_type sVar1;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  int local_44;
  char *pcStack_40;
  int i;
  char *p;
  string temp;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *map1_local;
  mailManager *this_local;
  
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this->map);
  std::__cxx11::string::string((string *)&p);
  local_44 = 0;
  mailSocket::sendData(this->socket,"stat\r\n");
  mailSocket::recvData(this->socket,this->recvData,0x400);
  mailSocket::sendData(this->socket,"list\r\n");
  mailSocket::recvData(this->socket,this->recvData,0x400);
  pcStack_40 = strtok(this->recvData,"\r\n");
  while (pcStack_40 != (char *)0x0) {
    local_44 = local_44 + 1;
    pcStack_40 = strtok((char *)0x0,"\r\n");
    if (*pcStack_40 == '.') break;
    std::__cxx11::string::operator=((string *)&p,pcStack_40);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<int_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
              (&local_80,&local_44,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&p);
    std::
    map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
    ::insert<std::pair<int,std::__cxx11::string>>
              ((map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>
                *)map1,&local_80);
    std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(&local_80);
  }
  sVar1 = std::
          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(map1);
  std::__cxx11::string::~string((string *)&p);
  return (int)sVar1;
}

Assistant:

int mailManager::listMail(std::map<int, string> *map1) {
    map.clear();
    string temp;
    char *p;
    int i = 0;

    socket->sendData("stat\r\n");
    socket->recvData(recvData, BUF_SIZE);

    socket->sendData("list\r\n");
    socket->recvData(recvData, BUF_SIZE);

    p = strtok(recvData, "\r\n");
    while (p) {
        i++;
        p = strtok(nullptr, "\r\n");
        if (*p == '.') {
            break;
        }
        temp = p;
        map1->insert(pair<int, string>(i, temp));
        //TODO 杨旭的任务：这里是得到的列表，使用top能够得到邮件的头部信息，解码存放到map1中
//        socket->sendData("top 1");

    }

    return (int) map1->size();
}